

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::setMinimumPDFVersion(QPDFWriter *this,PDFVersion *v)

{
  int extension_level;
  string version;
  int local_2c;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  PDFVersion::getVersion(v,&local_28,&local_2c);
  setMinimumPDFVersion(this,&local_28,local_2c);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
QPDFWriter::setMinimumPDFVersion(PDFVersion const& v)
{
    std::string version;
    int extension_level;
    v.getVersion(version, extension_level);
    setMinimumPDFVersion(version, extension_level);
}